

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_drm.c
# Opt level: O0

MPP_RET os_allocator_drm_open(void **ctx,size_t alignment,MppAllocFlagType flags)

{
  undefined4 *puVar1;
  int local_38;
  uint local_34;
  RK_S32 i;
  RK_S32 fd;
  allocator_ctx_drm *p;
  MppAllocFlagType flags_local;
  size_t alignment_local;
  void **ctx_local;
  
  if (ctx == (void **)0x0) {
    _mpp_log_l(2,"mpp_drm","does not accept NULL input\n","os_allocator_drm_open");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (void *)0x0;
    mpp_env_get_u32("drm_debug",&drm_debug,0);
    local_38 = 0;
    while ((local_38 < 2 && (local_34 = open64(dev_drm[local_38],0x80002), (int)local_34 < 1))) {
      local_38 = local_38 + 1;
    }
    if ((int)local_34 < 0) {
      _mpp_log_l(2,"mpp_drm","open all drm device failed.\n","os_allocator_drm_open");
      _mpp_log_l(2,"mpp_drm","Please check the following device path and access permission:\n",
                 (char *)0x0);
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        _mpp_log_l(2,"mpp_drm","%s\n",(char *)0x0,dev_drm[local_38]);
      }
      ctx_local._4_4_ = MPP_ERR_UNKNOW;
    }
    else {
      drm_ioctl(local_34,0x641f,(void *)0x0);
      if ((drm_debug & 2) != 0) {
        _mpp_log_l(4,"mpp_drm","open drm dev fd %d flags %x\n","os_allocator_drm_open",
                   (ulong)local_34,(ulong)flags);
      }
      puVar1 = (undefined4 *)mpp_osal_malloc("os_allocator_drm_open",0xc);
      if (puVar1 == (undefined4 *)0x0) {
        close(local_34);
        _mpp_log_l(2,"mpp_drm","failed to allocate context\n","os_allocator_drm_open");
        ctx_local._4_4_ = MPP_ERR_MALLOC;
      }
      else {
        *puVar1 = (int)alignment;
        puVar1[2] = flags;
        puVar1[1] = local_34;
        *ctx = puVar1;
        ctx_local._4_4_ = MPP_OK;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET os_allocator_drm_open(void **ctx, size_t alignment, MppAllocFlagType flags)
{
    allocator_ctx_drm *p;
    RK_S32 fd;
    RK_S32 i;

    if (NULL == ctx) {
        mpp_err_f("does not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    *ctx = NULL;

    mpp_env_get_u32("drm_debug", &drm_debug, 0);

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dev_drm); i++) {
        fd = open(dev_drm[i], O_RDWR | O_CLOEXEC);
        if (fd > 0)
            break;
    }

    if (fd < 0) {
        mpp_err_f("open all drm device failed.\n");
        mpp_err("Please check the following device path and access permission:\n");
        for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dev_drm); i++)
            mpp_err("%s\n", dev_drm[i]);
        return MPP_ERR_UNKNOW;
    } else {
        /* drop master by default to avoid becoming the drm master */
        drm_ioctl(fd, DRM_IOCTL_DROP_MASTER, 0);
    }

    drm_dbg_dev("open drm dev fd %d flags %x\n", fd, flags);

    p = mpp_malloc(allocator_ctx_drm, 1);
    if (NULL == p) {
        close(fd);
        mpp_err_f("failed to allocate context\n");
        return MPP_ERR_MALLOC;
    } else {
        /*
         * default drm use cma, do nothing here
         */
        p->alignment    = alignment;
        p->flags        = flags;
        p->drm_device   = fd;
        *ctx = p;
    }

    return MPP_OK;
}